

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shapes.cpp
# Opt level: O0

void pbrt::Triangle::Init(Allocator alloc)

{
  polymorphic_allocator<std::byte> *in_stack_00000008;
  polymorphic_allocator<std::byte> *in_stack_00000010;
  
  allMeshes = pstd::pmr::polymorphic_allocator<std::byte>::
              new_object<pstd::vector<pbrt::TriangleMesh_const*,pstd::pmr::polymorphic_allocator<pbrt::TriangleMesh_const*>>,pstd::pmr::polymorphic_allocator<std::byte>&>
                        (in_stack_00000010,in_stack_00000008);
  return;
}

Assistant:

void Triangle::Init(Allocator alloc) {
    allMeshes = alloc.new_object<pstd::vector<const TriangleMesh *>>(alloc);
#if defined(PBRT_BUILD_GPU_RENDERER)
    if (Options->useGPU)
        CUDA_CHECK(
            cudaMemcpyToSymbol(allTriangleMeshesGPU, &allMeshes, sizeof(allMeshes)));
#endif
}